

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

void write_at(ValueArray *value_array,uint64_t index,CrispyValue value)

{
  ulong uVar1;
  CrispyValue *__dest;
  size_t __nmemb;
  CrispyValue *pCVar2;
  
  uVar1 = value_array->cap;
  if (uVar1 <= index) {
    pCVar2 = value_array->values;
    do {
      __nmemb = uVar1 * 2;
      if (uVar1 < 8) {
        __nmemb = 8;
      }
      value_array->cap = __nmemb;
      __dest = (CrispyValue *)calloc(__nmemb,0x10);
      memcpy(__dest,pCVar2,value_array->count << 4);
      free(pCVar2);
      value_array->values = __dest;
      uVar1 = value_array->cap;
      pCVar2 = __dest;
    } while (uVar1 <= index);
  }
  if (value_array->count <= index) {
    value_array->count = index + 1;
  }
  pCVar2 = value_array->values;
  pCVar2[index].type = value.type;
  pCVar2[index].field_1.p_value = (uint64_t)value.field_1;
  return;
}

Assistant:

void write_at(ValueArray *value_array, uint64_t index, CrispyValue value) {
    while (index >= value_array->cap) {
        value_array->cap = GROW_CAP(value_array->cap);
        // value_array->values = GROW_ARR(value_array->values, CrispyValue, value_array->cap);
        CrispyValue *temp = calloc(value_array->cap, sizeof(CrispyValue));
        memcpy(temp, value_array->values, value_array->count * sizeof(CrispyValue));
        free(value_array->values);
        value_array->values = temp;
    }

    if (index > value_array->count) {
        value_array->count = index + 1;
    } else if (index == value_array->count) {
        ++value_array->count;
    }

    value_array->values[index] = value;
}